

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O2

vector<char32_t,_std::allocator<char32_t>_> * __thiscall
cpsm::decode<cpsm::Utf8StringTraits>
          (vector<char32_t,_std::allocator<char32_t>_> *__return_storage_ptr__,cpsm *this,
          string_ref str)

{
  string_ref str_00;
  
  (__return_storage_ptr__->super__Vector_base<char32_t,_std::allocator<char32_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char32_t,_std::allocator<char32_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char32_t,_std::allocator<char32_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  str_00.len_ = (size_t)str.ptr_;
  str_00.ptr_ = (char *)this;
  decode_to<cpsm::Utf8StringTraits>(str_00,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename StringTraits::Char> decode(boost::string_ref const str) {
  std::vector<typename StringTraits::Char> vec;
  decode_to<StringTraits>(str, vec);
  return vec;
}